

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<float>,_ImPlot::TransformerLogLin>::operator()
          (StairsRenderer<ImPlot::GetterYs<float>,_ImPlot::TransformerLogLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  ImU32 IVar6;
  GetterYs<float> *pGVar7;
  TransformerLogLin *pTVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  ImPlotContext *pIVar12;
  bool bVar13;
  double dVar14;
  ImVec2 IVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  pIVar12 = GImPlot;
  pGVar7 = this->Getter;
  pTVar8 = this->Transformer;
  iVar5 = pGVar7->Count;
  fVar2 = *(float *)((long)pGVar7->Ys +
                    (long)(((prim + 1 + pGVar7->Offset) % iVar5 + iVar5) % iVar5) *
                    (long)pGVar7->Stride);
  dVar14 = log10(((double)(prim + 1) * pGVar7->XScale + pGVar7->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar12->CurrentPlot;
  dVar3 = (pIVar9->XAxis).Range.Min;
  iVar5 = pTVar8->YAxis;
  IVar15.x = (float)((((double)(float)(dVar14 / pIVar12->LogDenX) *
                       ((pIVar9->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar12->Mx +
                    (double)pIVar12->PixelRange[iVar5].Min.x);
  fVar16 = (float)(((double)fVar2 - pIVar9->YAxis[iVar5].Range.Min) * pIVar12->My[iVar5] +
                  (double)pIVar12->PixelRange[iVar5].Min.y);
  fVar2 = (this->P1).x;
  fVar17 = (this->P1).y;
  fVar18 = fVar17;
  if (fVar16 <= fVar17) {
    fVar18 = fVar16;
  }
  bVar13 = false;
  if ((fVar18 < (cull_rect->Max).y) &&
     (fVar17 = (float)(-(uint)(fVar16 <= fVar17) & (uint)fVar17 |
                      ~-(uint)(fVar16 <= fVar17) & (uint)fVar16), pfVar1 = &(cull_rect->Min).y,
     bVar13 = false, *pfVar1 <= fVar17 && fVar17 != *pfVar1)) {
    fVar17 = fVar2;
    if (IVar15.x <= fVar2) {
      fVar17 = IVar15.x;
    }
    if (fVar17 < (cull_rect->Max).x) {
      fVar17 = (float)(~-(uint)(IVar15.x <= fVar2) & (uint)IVar15.x |
                      -(uint)(IVar15.x <= fVar2) & (uint)fVar2);
      bVar13 = (cull_rect->Min).x <= fVar17 && fVar17 != (cull_rect->Min).x;
    }
  }
  if (bVar13 != false) {
    fVar17 = (this->P1).y;
    fVar18 = fVar17 + this->HalfWeight;
    fVar17 = fVar17 - this->HalfWeight;
    IVar6 = this->Col;
    IVar4 = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    (pIVar10->pos).x = fVar2;
    (pIVar10->pos).y = fVar18;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar6;
    pIVar10[1].pos.x = IVar15.x;
    pIVar10[1].pos.y = fVar17;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar6;
    pIVar10[2].pos.x = fVar2;
    pIVar10[2].pos.y = fVar17;
    pIVar10[2].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar6;
    pIVar10[3].pos.x = IVar15.x;
    pIVar10[3].pos.y = fVar18;
    pIVar10[3].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = DrawList->_VtxCurrentIdx;
    puVar11[1] = DrawList->_VtxCurrentIdx + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    puVar11[3] = DrawList->_VtxCurrentIdx;
    puVar11[4] = DrawList->_VtxCurrentIdx + 1;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar18 = IVar15.x - this->HalfWeight;
    fVar17 = this->HalfWeight + IVar15.x;
    fVar2 = (this->P1).y;
    IVar6 = this->Col;
    IVar4 = *uv;
    pIVar10[4].pos.x = fVar18;
    pIVar10[4].pos.y = fVar16;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar6;
    pIVar10[1].pos.x = fVar17;
    pIVar10[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar6;
    pIVar10[2].pos.x = fVar18;
    pIVar10[2].pos.y = fVar2;
    pIVar10[2].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar6;
    pIVar10[3].pos.x = fVar17;
    pIVar10[3].pos.y = fVar16;
    pIVar10[3].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = DrawList->_VtxCurrentIdx;
    puVar11[1] = DrawList->_VtxCurrentIdx + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    puVar11[3] = DrawList->_VtxCurrentIdx;
    puVar11[4] = DrawList->_VtxCurrentIdx + 1;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar15.y = fVar16;
  this->P1 = IVar15;
  return bVar13;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }